

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaDemuxer.cpp
# Opt level: O0

int pipScaleFromStr(string *value)

{
  bool bVar1;
  string local_58;
  undefined1 local_38 [8];
  string v;
  string *value_local;
  
  v.field_2._8_8_ = value;
  strToLowerCase(&local_58,value);
  trimStr((string *)local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38,"1/2");
  if (!bVar1) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_38,"0.5");
    if (!bVar1) {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_38,"1/4");
      if (!bVar1) {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_38,"0.25");
        if (!bVar1) {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_38,"1.5");
          if (bVar1) {
            value_local._4_4_ = 4;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_38,"fullscreen");
            if (bVar1) {
              value_local._4_4_ = 5;
            }
            else {
              value_local._4_4_ = 1;
            }
          }
          goto LAB_002e393e;
        }
      }
      value_local._4_4_ = 3;
      goto LAB_002e393e;
    }
  }
  value_local._4_4_ = 2;
LAB_002e393e:
  std::__cxx11::string::~string((string *)local_38);
  return value_local._4_4_;
}

Assistant:

int pipScaleFromStr(const std::string& value)
{
    const std::string v = trimStr(strToLowerCase(value));

    if (v == "1/2" || v == "0.5")
        return 2;
    if (v == "1/4" || v == "0.25")
        return 3;
    if (v == "1.5")
        return 4;
    if (v == "fullscreen")
        return 5;

    return 1;  // default
}